

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivar.c
# Opt level: O1

void objc_compute_ivar_offsets(Class class)

{
  objc_ivar_list *poVar1;
  int *piVar2;
  Class poVar3;
  objc_class_gsv1 *poVar4;
  objc_ivar_list_gcc *poVar5;
  ptrdiff_t pVar6;
  id_conflict *addr;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  id_conflict obj;
  int iVar10;
  Ivar in_RSI;
  objc_ivar_list *poVar11;
  long lVar12;
  long lVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  
  if (class->ivars == (objc_ivar_list *)0x0) {
    poVar3 = class_getSuperclass(class);
    if (poVar3 != (Class)0x0) {
      class->instance_size = poVar3->instance_size;
    }
  }
  else {
    if (class->ivars->size != 0x20) {
      objc_compute_ivar_offsets_cold_1();
      pVar6 = ivar_getOffset(in_RSI);
      addr = (id_conflict *)((long)&class->isa + pVar6);
      switch(in_RSI->flags & 3) {
      default:
        *addr = obj;
        return;
      case 1:
        objc_storeStrong(addr,obj);
        return;
      case 2:
        objc_storeWeak(addr,obj);
        return;
      }
    }
    if (class->instance_size < 1) {
      poVar3 = class_getSuperclass(class);
      if (poVar3 == (Class)0x0) {
        lVar12 = 0;
      }
      else {
        if (poVar3->instance_size < 1) {
          objc_compute_ivar_offsets(poVar3);
        }
        lVar12 = poVar3->instance_size;
      }
      class->instance_size = lVar12;
      poVar1 = class->ivars;
      if (poVar1 != (objc_ivar_list *)0x0) {
        if (0 < poVar1->count) {
          lVar14 = -1;
          lVar13 = 0;
          uVar15 = 0;
          lVar8 = -0x8000000000000000;
          do {
            if (poVar1->size < 0x20) goto LAB_00112d26;
            lVar18 = poVar1->size * lVar13;
            if (((int)*(size_t *)((long)&poVar1[2].size + lVar18) == 0) &&
               (**(char **)((long)&poVar1[1].size + lVar18) == 'B')) {
              *(undefined4 *)((long)&poVar1[2].size + lVar18) = 1;
            }
            piVar2 = *(int **)((long)&poVar1[2].count + lVar18);
            lVar16 = (long)*piVar2;
            if (lVar16 < (long)(lVar8 + uVar15)) {
              *piVar2 = ((int)lVar14 - (int)lVar8) + *piVar2;
              lVar16 = lVar8;
            }
            else {
              uVar17 = (ulong)(uint)*(size_t *)((long)&poVar1[2].size + lVar18);
              iVar10 = (int)lVar12;
              *piVar2 = iVar10;
              lVar14 = (long)iVar10;
              lVar12 = lVar12 + uVar17;
              uVar15 = (ulong)(uint)*(size_t *)((long)&poVar1[2].size + lVar18);
              uVar7 = (ulong)(1 << ((byte)(*(uint *)((long)&poVar1[2].size + lVar18 + 4) >> 3) &
                                   0x1f));
              uVar9 = (lVar14 + 8U) % uVar7;
              if (uVar9 != 0) {
                lVar8 = uVar7 - uVar9;
                *piVar2 = (int)lVar8 + iVar10;
                class->instance_size = class->instance_size + lVar8;
                lVar12 = lVar8 + lVar12;
              }
              if (((long)*piVar2 + 8U) %
                  (ulong)(long)(1 << ((byte)(*(uint *)((long)&poVar1[2].size + lVar18 + 4) >> 3) &
                                     0x1f)) != 0) {
                __assert_fail("(*ivar->offset + sizeof(uintptr_t)) % ivarGetAlign(ivar) == 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/ivar.c"
                              ,0x6b,"void objc_compute_ivar_offsets(Class)");
              }
              class->instance_size = class->instance_size + uVar17;
            }
            lVar13 = lVar13 + 1;
            lVar8 = lVar16;
          } while (lVar13 < poVar1->count);
        }
        poVar4 = objc_legacy_class_for_class(class);
        if ((poVar4 != (objc_class_gsv1 *)0x0) && (poVar1 = class->ivars, 0 < poVar1->count)) {
          uVar15 = poVar1->size;
          if (uVar15 < 0x20) {
LAB_00112d26:
            __assert_fail("l->size >= sizeof(struct objc_ivar)",
                          "/workspace/llm4binary/github/license_c_cmakelists/gnustep[P]libobjc2/ivar.h"
                          ,0xb9,"struct objc_ivar *ivar_at_index(struct objc_ivar_list *, int)");
          }
          poVar11 = poVar1 + 2;
          poVar5 = poVar4->ivars;
          lVar12 = 0;
          do {
            poVar5 = poVar5 + 3;
            poVar5->count = **(int **)poVar11;
            lVar12 = lVar12 + 1;
            poVar11 = (objc_ivar_list *)((long)&poVar11->count + uVar15);
          } while (lVar12 < poVar1->count);
        }
      }
    }
  }
  return;
}

Assistant:

PRIVATE void objc_compute_ivar_offsets(Class class)
{
	if (class->ivars == NULL)
	{
		Class super_class = class_getSuperclass(class);
		if (super_class != Nil)
		{
			class->instance_size = super_class->instance_size;
		}
		return;
	}
	if (class->ivars->size != sizeof(struct objc_ivar))
	{
		fprintf(stderr, "Downgrading ivar struct not yet implemented");
		abort();
	}
	int i = 0;
	/* If this class was compiled with support for late-bound ivars, the
	* instance_size field will contain 0 - {the size of the instance variables
	* declared for just this class}.  The individual instance variable offset
	* fields will then be the offsets from the start of the class, and so must
	* have the size of the parent class prepended. */
	if (class->instance_size <= 0)
	{
		Class super = class_getSuperclass(class);
		long ivar_start = 0;
		if (Nil != super)
		{
			if (super->instance_size <= 0)
			{
				objc_compute_ivar_offsets(super);
			}
			ivar_start = super->instance_size;
		}
		class->instance_size = ivar_start;
		/* For each instance variable, we add the offset if required (it will be zero
		* if this class is compiled with a static ivar layout).  We then set the
		* value of a global variable to the offset value.  
		*
		* Any class compiled with support for the non-fragile ABI, but not actually
		* using it, will export the ivar offset field as a symbol.
		*
		* Note that using non-fragile ivars breaks @defs().  If you need equivalent
		* functionality, provide an alternative @interface with all variables
		* declared @public.
		*/
		if (class->ivars)
		{
			// If the first instance variable had any alignment padding, then we need 
			// to discard it.  We will recompute padding ourself later.
			long next_ivar = ivar_start;
			long last_offset = LONG_MIN;
			long last_size = 0;
			long last_computed_offset = -1;
			size_t refcount_size = sizeof(uintptr_t);
			for (i = 0 ; i < class->ivars->count ; i++)
			{
				struct objc_ivar *ivar = ivar_at_index(class->ivars, i);
				// Clang 7 and 8 have a bug where the size of _Bool is encoded
				// as 0, not 1.  Silently fix this up when we see it.
				if (ivar->size == 0 && ivar->type[0] == 'B')
				{
					ivar->size = 1;
				}
				// We are going to be allocating an extra word for the reference count
				// in front of the object.  This doesn't matter for aligment most of
				// the time, but if we have an instance variable that is a vector type
				// then we will need to ensure that we are properly aligned again.
				long ivar_size = ivar->size;
				// Bitfields have the same offset - the base of the variable
				// that contains them.  If we are in a bitfield, then we need
				// to make sure that we don't add any displacement from the
				// previous value.
				if (*ivar->offset < last_offset + last_size)
				{
					*ivar->offset = last_computed_offset + (*ivar->offset - last_offset);
					ivar_size = 0;
					continue;
				}
				last_offset = *ivar->offset;
				*ivar->offset = next_ivar;
				last_computed_offset = *ivar->offset;
				next_ivar += ivar_size;
				last_size = ivar->size;
				size_t align = ivarGetAlign(ivar);
				if ((*ivar->offset + refcount_size) % align != 0)
				{
					long padding = align - ((*ivar->offset + refcount_size) % align); 
					*ivar->offset += padding;
					class->instance_size += padding;
					next_ivar += padding;
				}
				assert((*ivar->offset + sizeof(uintptr_t)) % ivarGetAlign(ivar) == 0);
				class->instance_size += ivar_size;
			}
#ifdef OLDABI_COMPAT
			// If we have a legacy ivar list, update the offset in it too -
			// code from older compilers may access this directly!
			struct objc_class_gsv1* legacy = objc_legacy_class_for_class(class);
			if (legacy)
			{
				for (i = 0 ; i < class->ivars->count ; i++)
				{
					legacy->ivars->ivar_list[i].offset = *ivar_at_index(class->ivars, i)->offset;
				}
			}
#endif
		}
	}
}